

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O1

CURLcode randit(Curl_easy *data,uint *rnd)

{
  CURLcode CVar1;
  int __fd;
  ssize_t sVar2;
  curltime cVar3;
  
  CVar1 = Curl_ssl_random(data,(uchar *)rnd,4);
  if (CVar1 == CURLE_NOT_BUILT_IN) {
    if (randit_seeded == '\0') {
      __fd = open64("/dev/urandom",0);
      if (-1 < __fd) {
        sVar2 = read(__fd,&randit::randseed,4);
        if (sVar2 == 4) {
          randit_seeded = '\x01';
        }
        close(__fd);
      }
    }
    if (randit_seeded == '\0') {
      cVar3 = Curl_now();
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"WARNING: using weak random seed");
      }
      randit::randseed =
           (cVar3.tv_usec + (int)cVar3.tv_sec + randit::randseed) * -0x7f82434b + 0xa70427df;
      randit_seeded = '\x01';
    }
    randit::randseed = randit::randseed * 0x41c64e6d + 0x3039;
    *rnd = randit::randseed * 0x10000 | randit::randseed >> 0x10;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode randit(struct Curl_easy *data, unsigned int *rnd)
{
  CURLcode result = CURLE_OK;
  static unsigned int randseed;
  static bool seeded = FALSE;

#ifdef CURLDEBUG
  char *force_entropy = getenv("CURL_ENTROPY");
  if(force_entropy) {
    if(!seeded) {
      unsigned int seed = 0;
      size_t elen = strlen(force_entropy);
      size_t clen = sizeof(seed);
      size_t min = elen < clen ? elen : clen;
      memcpy((char *)&seed, force_entropy, min);
      randseed = ntohl(seed);
      seeded = TRUE;
    }
    else
      randseed++;
    *rnd = randseed;
    return CURLE_OK;
  }
#endif

  /* data may be NULL! */
  result = Curl_ssl_random(data, (unsigned char *)rnd, sizeof(*rnd));
  if(result != CURLE_NOT_BUILT_IN)
    /* only if there is no random function in the TLS backend do the non crypto
       version, otherwise return result */
    return result;

  /* ---- non-cryptographic version following ---- */

#ifdef _WIN32
  if(!seeded) {
    result = Curl_win32_random((unsigned char *)rnd, sizeof(*rnd));
    if(result != CURLE_NOT_BUILT_IN)
      return result;
  }
#endif

#if defined(HAVE_ARC4RANDOM) && !defined(USE_OPENSSL)
  if(!seeded) {
    *rnd = (unsigned int)arc4random();
    return CURLE_OK;
  }
#endif

#if defined(RANDOM_FILE) && !defined(_WIN32)
  if(!seeded) {
    /* if there's a random file to read a seed from, use it */
    int fd = open(RANDOM_FILE, O_RDONLY);
    if(fd > -1) {
      /* read random data into the randseed variable */
      ssize_t nread = read(fd, &randseed, sizeof(randseed));
      if(nread == sizeof(randseed))
        seeded = TRUE;
      close(fd);
    }
  }
#endif

  if(!seeded) {
    struct curltime now = Curl_now();
    infof(data, "WARNING: using weak random seed");
    randseed += (unsigned int)now.tv_usec + (unsigned int)now.tv_sec;
    randseed = randseed * 1103515245 + 12345;
    randseed = randseed * 1103515245 + 12345;
    randseed = randseed * 1103515245 + 12345;
    seeded = TRUE;
  }

  {
    unsigned int r;
    /* Return an unsigned 32-bit pseudo-random number. */
    r = randseed = randseed * 1103515245 + 12345;
    *rnd = (r << 16) | ((r >> 16) & 0xFFFF);
  }
  return CURLE_OK;
}